

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

ostream * nlohmann::operator<<
                    (ostream *o,
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *j)

{
  streamsize sVar1;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_RDI;
  serializer s;
  streamsize indentation;
  bool pretty_print;
  output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0 [2];
  char in_stack_fffffffffffffd67;
  output_adapter_t<char> *in_stack_fffffffffffffd68;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffd70;
  uint in_stack_fffffffffffffdbc;
  uint in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc6;
  undefined1 in_stack_fffffffffffffdc7;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffdc8;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffdd0;
  
  sVar1 = std::ios_base::width
                    ((ios_base *)
                     ((in_RDI->number_buffer)._M_elems +
                     (long)((in_RDI->o).
                            super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr[-3]._vptr_output_adapter_protocol + -2)));
  if (0 < sVar1) {
    std::ios_base::width
              ((ios_base *)
               ((in_RDI->number_buffer)._M_elems +
               (long)((in_RDI->o).
                      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr[-3]._vptr_output_adapter_protocol + -2)));
  }
  std::ios_base::width
            ((ios_base *)
             ((in_RDI->number_buffer)._M_elems +
             (long)((in_RDI->o).
                    super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr[-3]._vptr_output_adapter_protocol + -2)),0);
  detail::
  output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::output_adapter(local_2c0,
                   (basic_ostream<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  detail::output_adapter::operator_cast_to_shared_ptr(in_stack_fffffffffffffd08);
  std::ios::fill();
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::serializer(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd67);
  std::shared_ptr<nlohmann::detail::output_adapter_protocol<char>_>::~shared_ptr
            ((shared_ptr<nlohmann::detail::output_adapter_protocol<char>_> *)0x1208d8);
  detail::
  output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~output_adapter((output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x1208e2);
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::dump(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(bool)in_stack_fffffffffffffdc7,
         (bool)in_stack_fffffffffffffdc6,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::~serializer(in_RDI);
  return (ostream *)in_RDI;
}

Assistant:

friend std::ostream& operator<<(std::ostream& o, const basic_json& j)
{
// read width member and use it as indentation parameter if nonzero
const bool pretty_print = (o.width() > 0);
const auto indentation = (pretty_print ? o.width() : 0);

// reset width to 0 for subsequent calls to this stream
o.width(0);

// do the actual serialization
serializer s(detail::output_adapter<char>(o), o.fill());
s.dump(j, pretty_print, false, static_cast<unsigned int>(indentation));
return o;
}